

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

void __thiscall
flatbuffers::python::PythonGenerator::GenStruct
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr,ImportMap *imports)

{
  bool bVar1;
  long lVar2;
  reference ppFVar3;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_30;
  const_iterator it;
  ImportMap *imports_local;
  string *code_ptr_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  
  if (((struct_def->super_Definition).generated & 1U) == 0) {
    it._M_current = (FieldDef **)imports;
    GenComment(&(struct_def->super_Definition).doc_comment,code_ptr,
               (CommentConfig *)(anonymous_namespace)::def_comment,"");
    BeginClass(this,struct_def,code_ptr);
    if ((struct_def->fixed & 1U) == 0) {
      NewRootTypeFromBuffer(this,struct_def,code_ptr);
      lVar2 = std::__cxx11::string::length();
      if (lVar2 != 0) {
        GenHasFileIdentifier(this,struct_def,code_ptr);
      }
    }
    else {
      GenStructSizeOf(this,struct_def,code_ptr);
    }
    InitializeExisting(this,struct_def,code_ptr);
    local_30._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                   (&(struct_def->fields).vec);
    while( true ) {
      field = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (&(struct_def->fields).vec);
      bVar1 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                          *)&field);
      if (!bVar1) break;
      ppFVar3 = __gnu_cxx::
                __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                ::operator*(&local_30);
      if (((*ppFVar3)->deprecated & 1U) == 0) {
        GenStructAccessor(this,struct_def,*ppFVar3,code_ptr,(ImportMap *)it._M_current);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&local_30);
    }
    if ((struct_def->fixed & 1U) == 0) {
      GenTableBuilders(this,struct_def,code_ptr);
    }
    else {
      GenStructBuilder(this,struct_def,code_ptr);
    }
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def, std::string *code_ptr,
                 ImportMap &imports) const {
    if (struct_def.generated) return;

    GenComment(struct_def.doc_comment, code_ptr, &def_comment);
    BeginClass(struct_def, code_ptr);
    if (!struct_def.fixed) {
      // Generate a special accessor for the table that has been declared as
      // the root type.
      NewRootTypeFromBuffer(struct_def, code_ptr);
      if (parser_.file_identifier_.length()) {
        // Generate a special function to test file_identifier
        GenHasFileIdentifier(struct_def, code_ptr);
      }
    } else {
      // Generates the SizeOf method for all structs.
      GenStructSizeOf(struct_def, code_ptr);
    }
    // Generates the Init method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    InitializeExisting(struct_def, code_ptr);
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      GenStructAccessor(struct_def, field, code_ptr, imports);
    }

    if (struct_def.fixed) {
      // creates a struct constructor function
      GenStructBuilder(struct_def, code_ptr);
    } else {
      // Creates a set of functions that allow table construction.
      GenTableBuilders(struct_def, code_ptr);
    }
  }